

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmMulMont2(word *c,word *a,word *b,qr_o *r,void *stack)

{
  word wVar1;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *unaff_retaddr;
  word *prod;
  zm_mont_params_st *params;
  size_t k;
  ulong local_30;
  word *stack_00;
  
  wVar1 = in_RCX[5];
  stack_00 = in_R8 + in_RCX[6] * 2;
  zzMul(unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX,(size_t)in_RCX,stack_00);
  zzRedMont(unaff_retaddr,in_RDI,(size_t)in_RSI,(word)in_RDX,in_RCX);
  wwCopy(in_RDI,in_R8,in_RCX[6]);
  for (local_30 = *(ulong *)(wVar1 + 8); local_30 < in_RCX[6] << 6; local_30 = local_30 + 1) {
    zzDoubleMod(in_RSI,in_RDX,in_RCX,(size_t)stack_00);
  }
  return;
}

Assistant:

static void zmMulMont2(word c[], const word a[], const word b[],
	const qr_o* r, void* stack)
{
	register size_t k;
	const zm_mont_params_st* params;
	word* prod = (word*)stack;
	// pre
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	ASSERT(zmIsIn(b, r));
	// настроить указатели
	params = (const zm_mont_params_st*)r->params;
	stack = prod + 2 * r->n;
	// c <- a b B^{-n} \mod mod
	zzMul(prod, a, r->n, b, r->n, stack);
	zzRedMont(prod, r->mod, r->n, *(word*)r->params, stack);
	wwCopy(c, prod, r->n);
	// c <- c * B^n / 2^l \mod mod
	for (k = params->l; k < B_PER_W * r->n; ++k)
		zzDoubleMod(c, c, r->mod, r->n);
}